

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  FieldGenerator *pFVar2;
  Descriptor *pDVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  io::Printer::Print(printer,"void $classname$::SharedDtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) == '\x01') {
    io::Printer::Print(printer,
                       "::google::protobuf::Arena* arena = GetArenaNoVirtual();\nif (arena != NULL) {\n  return;\n}\n\n"
                      );
  }
  ppFVar1 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
    uVar5 = 0;
    do {
      pFVar2 = FieldGeneratorMap::get(&this->field_generators_,ppFVar1[uVar5]);
      (*pFVar2->_vptr_FieldGenerator[0xf])(pFVar2,printer);
      uVar5 = uVar5 + 1;
      ppFVar1 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->optimized_order_).
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3))
    ;
  }
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x38)) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      io::Printer::Print(printer,"if (has_$oneof_name$()) {\n  clear_$oneof_name$();\n}\n",
                         "oneof_name",*(string **)(*(long *)(pDVar3 + 0x40) + lVar6));
      lVar4 = lVar4 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x30;
    } while (lVar4 < *(int *)(pDVar3 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.ClearAll();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedDestructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedDtor() {\n",
    "classname", classname_);
  printer->Indent();
  if (SupportsArenas(descriptor_)) {
    // Do nothing when the message is allocated in an arena.
    printer->Print(
      "::google::protobuf::Arena* arena = GetArenaNoVirtual();\n"
      "if (arena != NULL) {\n"
      "  return;\n"
      "}\n"
      "\n");
  }

  // Write the destructors for each field except oneof members.
  // optimized_order_ does not contain oneof fields.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    field_generators_.get(field).GenerateDestructorCode(printer);
  }

  // Generate code to destruct oneofs. Clearing should do the work.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "if (has_$oneof_name$()) {\n"
        "  clear_$oneof_name$();\n"
        "}\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}